

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCraneRailFShapeProfileDef::~IfcCraneRailFShapeProfileDef
          (IfcCraneRailFShapeProfileDef *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].Radius.have = 0x984140;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x80 = 0x984168;
  puVar1 = (undefined1 *)this[-1].CentreOfGravityInY.ptr;
  if (puVar1 != &this[-1].field_0xd8) {
    operator_delete(puVar1);
  }
  if ((Out *)this[-1].HeadDepth3 != &this[-1].BaseDepth1) {
    operator_delete((undefined1 *)this[-1].HeadDepth3);
  }
  operator_delete(&this[-1].Radius.have);
  return;
}

Assistant:

IfcCraneRailFShapeProfileDef() : Object("IfcCraneRailFShapeProfileDef") {}